

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh_personality.c
# Opt level: O0

void objc_exception_rethrow(_Unwind_Exception *e)

{
  BOOL BVar1;
  int iVar2;
  thread_data *ptVar3;
  objc_exception *poVar4;
  SEL selector;
  IMP p_Var5;
  IMP rethrow;
  id object;
  SEL rethrow_sel;
  _Unwind_Reason_Code err;
  objc_exception *ex;
  thread_data *td;
  _Unwind_Exception *e_local;
  uintptr_t addr;
  Class local_10;
  
  ptVar3 = get_thread_data_fast();
  if (ptVar3->current_exception_type != OBJC) {
    if (ptVar3->current_exception_type == CXX) {
      if (e->exception_class != cxx_exception_class) {
        __assert_fail("e->exception_class == cxx_exception_class",
                      "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/eh_personality.c"
                      ,0x2ec,"void objc_exception_rethrow(struct _Unwind_Exception *)");
      }
      __cxa_rethrow();
    }
    if (ptVar3->current_exception_type == BOXED_FOREIGN) {
      selector = sel_registerName("rethrow");
      poVar4 = ptVar3->caughtExceptions;
      if (poVar4 != (objc_exception *)0x0) {
        BVar1 = isSmallObject((id)poVar4);
        if (BVar1 == '\0') {
          local_10 = *(Class *)poVar4;
        }
        else {
          local_10 = SmallObjectClasses[(ulong)poVar4 & 7];
        }
        BVar1 = class_respondsToSelector(local_10,selector);
        if (BVar1 != '\0') {
          p_Var5 = objc_msg_lookup((id)poVar4,selector);
          (*p_Var5)((id)poVar4,selector);
        }
      }
    }
    if ((objc_exception *)e != ptVar3->caughtExceptions) {
      __assert_fail("e == (struct _Unwind_Exception*)td->caughtExceptions",
                    "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/eh_personality.c"
                    ,0x2fc,"void objc_exception_rethrow(struct _Unwind_Exception *)");
    }
    _Unwind_Resume_or_Rethrow(e);
    abort();
  }
  poVar4 = objc_exception_from_header(e);
  if (e->exception_class != 0x474e55434f424a43) {
    __assert_fail("e->exception_class == objc_exception_class",
                  "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/eh_personality.c"
                  ,0x2db,"void objc_exception_rethrow(struct _Unwind_Exception *)");
  }
  if (poVar4 != ptVar3->caughtExceptions) {
    __assert_fail("ex == td->caughtExceptions",
                  "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/eh_personality.c"
                  ,0x2dc,"void objc_exception_rethrow(struct _Unwind_Exception *)");
  }
  if (poVar4->catch_count < 1) {
    __assert_fail("ex->catch_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/eh_personality.c"
                  ,0x2dd,"void objc_exception_rethrow(struct _Unwind_Exception *)");
  }
  poVar4->catch_count = -poVar4->catch_count;
  iVar2 = _Unwind_Resume_or_Rethrow(e);
  free(poVar4);
  if ((iVar2 == 5) && (_objc_unexpected_exception != (_func_void_id *)0x0)) {
    (*_objc_unexpected_exception)(poVar4->object);
  }
  abort();
}

Assistant:

OBJC_PUBLIC void objc_exception_rethrow(struct _Unwind_Exception *e)
{
	struct thread_data *td = get_thread_data_fast();
	// If this is an Objective-C exception, then 
	if (td->current_exception_type == OBJC)
	{
		struct objc_exception *ex = objc_exception_from_header(e);
		assert(e->exception_class == objc_exception_class);
		assert(ex == td->caughtExceptions);
		assert(ex->catch_count > 0);
		// Negate the catch count, so that we can detect that this is a
		// rethrown exception in objc_end_catch
		ex->catch_count = -ex->catch_count;
		_Unwind_Reason_Code err = _Unwind_Resume_or_Rethrow(e);
		free(ex);
		if (_URC_END_OF_STACK == err && 0 != _objc_unexpected_exception)
		{
			_objc_unexpected_exception(ex->object);
		}
		abort();
	}
#ifndef NO_OBJCXX
	else if (td->current_exception_type == CXX)
	{
		assert(e->exception_class == cxx_exception_class);
		__cxa_rethrow();
	}
#endif
	if (td->current_exception_type == BOXED_FOREIGN)
	{
		SEL rethrow_sel = sel_registerName("rethrow");
		id object = (id)td->caughtExceptions;
		if ((nil != object) &&
		    (class_respondsToSelector(classForObject(object), rethrow_sel)))
		{
			DEBUG_LOG("Rethrowing boxed exception\n");
			IMP rethrow = objc_msg_lookup(object, rethrow_sel);
			rethrow(object, rethrow_sel);
		}
	}
	assert(e == (struct _Unwind_Exception*)td->caughtExceptions);
	_Unwind_Resume_or_Rethrow(e);
	abort();
}